

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlAddDefAttrs(xmlParserCtxtPtr ctxt,xmlChar *fullname,xmlChar *fullattr,xmlChar *value)

{
  int iVar1;
  void *pvVar2;
  xmlHashTablePtr pxVar3;
  xmlChar *pxVar4;
  int *userdata;
  xmlDefAttrsPtr temp;
  xmlChar *prefix;
  xmlChar *name;
  int *piStack_30;
  int len;
  xmlDefAttrsPtr defaults;
  xmlChar *value_local;
  xmlChar *fullattr_local;
  xmlChar *fullname_local;
  xmlParserCtxtPtr ctxt_local;
  
  defaults = (xmlDefAttrsPtr)value;
  value_local = fullattr;
  fullattr_local = fullname;
  fullname_local = (xmlChar *)ctxt;
  if ((ctxt->attsSpecial != (xmlHashTablePtr)0x0) &&
     (pvVar2 = xmlHashLookup2(ctxt->attsSpecial,fullname,fullattr), pvVar2 != (void *)0x0)) {
    return;
  }
  if (*(long *)(fullname_local + 0x220) == 0) {
    pxVar3 = xmlHashCreateDict(10,*(xmlDictPtr *)(fullname_local + 0x1c8));
    *(xmlHashTablePtr *)(fullname_local + 0x220) = pxVar3;
    if (*(long *)(fullname_local + 0x220) == 0) goto LAB_00179638;
  }
  pxVar4 = xmlSplitQName3(fullattr_local,(int *)((long)&name + 4));
  if (pxVar4 == (xmlChar *)0x0) {
    prefix = xmlDictLookup(*(xmlDictPtr *)(fullname_local + 0x1c8),fullattr_local,-1);
    temp = (xmlDefAttrsPtr)0x0;
  }
  else {
    prefix = xmlDictLookup(*(xmlDictPtr *)(fullname_local + 0x1c8),pxVar4,-1);
    temp = (xmlDefAttrsPtr)
           xmlDictLookup(*(xmlDictPtr *)(fullname_local + 0x1c8),fullattr_local,name._4_4_);
  }
  piStack_30 = (int *)xmlHashLookup2(*(xmlHashTablePtr *)(fullname_local + 0x220),prefix,
                                     (xmlChar *)temp);
  if (piStack_30 == (int *)0x0) {
    piStack_30 = (int *)(*xmlMalloc)(0xa8);
    if (piStack_30 != (int *)0x0) {
      *piStack_30 = 0;
      piStack_30[1] = 4;
      iVar1 = xmlHashUpdateEntry2(*(xmlHashTablePtr *)(fullname_local + 0x220),prefix,
                                  (xmlChar *)temp,piStack_30,(xmlHashDeallocator)0x0);
      if (-1 < iVar1) goto LAB_001794db;
      (*xmlFree)(piStack_30);
    }
  }
  else {
    if (*piStack_30 < piStack_30[1]) {
LAB_001794db:
      pxVar4 = xmlSplitQName3(value_local,(int *)((long)&name + 4));
      if (pxVar4 == (xmlChar *)0x0) {
        prefix = xmlDictLookup(*(xmlDictPtr *)(fullname_local + 0x1c8),value_local,-1);
        temp = (xmlDefAttrsPtr)0x0;
      }
      else {
        prefix = xmlDictLookup(*(xmlDictPtr *)(fullname_local + 0x1c8),pxVar4,-1);
        temp = (xmlDefAttrsPtr)
               xmlDictLookup(*(xmlDictPtr *)(fullname_local + 0x1c8),value_local,name._4_4_);
      }
      *(xmlChar **)(piStack_30 + (long)(*piStack_30 * 5) * 2 + 2) = prefix;
      *(xmlDefAttrsPtr *)(piStack_30 + (long)(*piStack_30 * 5 + 1) * 2 + 2) = temp;
      name._4_4_ = xmlStrlen((xmlChar *)defaults);
      pxVar4 = xmlDictLookup(*(xmlDictPtr *)(fullname_local + 0x1c8),(xmlChar *)defaults,name._4_4_)
      ;
      *(xmlChar **)(piStack_30 + (long)(*piStack_30 * 5 + 2) * 2 + 2) = pxVar4;
      *(xmlChar **)(piStack_30 + (long)(*piStack_30 * 5 + 3) * 2 + 2) = pxVar4 + name._4_4_;
      if (*(int *)(fullname_local + 0x94) == 0) {
        iVar1 = *piStack_30;
        (piStack_30 + (long)(iVar1 * 5 + 4) * 2 + 2)[0] = 0;
        (piStack_30 + (long)(iVar1 * 5 + 4) * 2 + 2)[1] = 0;
      }
      else {
        *(char **)(piStack_30 + (long)(*piStack_30 * 5 + 4) * 2 + 2) = "external";
      }
      *piStack_30 = *piStack_30 + 1;
      return;
    }
    userdata = (int *)(*xmlRealloc)(piStack_30,(long)(piStack_30[1] * 10) * 8 + 8);
    if (userdata != (int *)0x0) {
      userdata[1] = userdata[1] << 1;
      piStack_30 = userdata;
      iVar1 = xmlHashUpdateEntry2(*(xmlHashTablePtr *)(fullname_local + 0x220),prefix,
                                  (xmlChar *)temp,userdata,(xmlHashDeallocator)0x0);
      if (-1 < iVar1) goto LAB_001794db;
      (*xmlFree)(piStack_30);
    }
  }
LAB_00179638:
  xmlErrMemory((xmlParserCtxtPtr)fullname_local,(char *)0x0);
  return;
}

Assistant:

static void
xmlAddDefAttrs(xmlParserCtxtPtr ctxt,
               const xmlChar *fullname,
               const xmlChar *fullattr,
               const xmlChar *value) {
    xmlDefAttrsPtr defaults;
    int len;
    const xmlChar *name;
    const xmlChar *prefix;

    /*
     * Allows to detect attribute redefinitions
     */
    if (ctxt->attsSpecial != NULL) {
        if (xmlHashLookup2(ctxt->attsSpecial, fullname, fullattr) != NULL)
	    return;
    }

    if (ctxt->attsDefault == NULL) {
        ctxt->attsDefault = xmlHashCreateDict(10, ctxt->dict);
	if (ctxt->attsDefault == NULL)
	    goto mem_error;
    }

    /*
     * split the element name into prefix:localname , the string found
     * are within the DTD and then not associated to namespace names.
     */
    name = xmlSplitQName3(fullname, &len);
    if (name == NULL) {
        name = xmlDictLookup(ctxt->dict, fullname, -1);
	prefix = NULL;
    } else {
        name = xmlDictLookup(ctxt->dict, name, -1);
	prefix = xmlDictLookup(ctxt->dict, fullname, len);
    }

    /*
     * make sure there is some storage
     */
    defaults = xmlHashLookup2(ctxt->attsDefault, name, prefix);
    if (defaults == NULL) {
        defaults = (xmlDefAttrsPtr) xmlMalloc(sizeof(xmlDefAttrs) +
	                   (4 * 5) * sizeof(const xmlChar *));
	if (defaults == NULL)
	    goto mem_error;
	defaults->nbAttrs = 0;
	defaults->maxAttrs = 4;
	if (xmlHashUpdateEntry2(ctxt->attsDefault, name, prefix,
	                        defaults, NULL) < 0) {
	    xmlFree(defaults);
	    goto mem_error;
	}
    } else if (defaults->nbAttrs >= defaults->maxAttrs) {
        xmlDefAttrsPtr temp;

        temp = (xmlDefAttrsPtr) xmlRealloc(defaults, sizeof(xmlDefAttrs) +
		       (2 * defaults->maxAttrs * 5) * sizeof(const xmlChar *));
	if (temp == NULL)
	    goto mem_error;
	defaults = temp;
	defaults->maxAttrs *= 2;
	if (xmlHashUpdateEntry2(ctxt->attsDefault, name, prefix,
	                        defaults, NULL) < 0) {
	    xmlFree(defaults);
	    goto mem_error;
	}
    }

    /*
     * Split the element name into prefix:localname , the string found
     * are within the DTD and hen not associated to namespace names.
     */
    name = xmlSplitQName3(fullattr, &len);
    if (name == NULL) {
        name = xmlDictLookup(ctxt->dict, fullattr, -1);
	prefix = NULL;
    } else {
        name = xmlDictLookup(ctxt->dict, name, -1);
	prefix = xmlDictLookup(ctxt->dict, fullattr, len);
    }

    defaults->values[5 * defaults->nbAttrs] = name;
    defaults->values[5 * defaults->nbAttrs + 1] = prefix;
    /* intern the string and precompute the end */
    len = xmlStrlen(value);
    value = xmlDictLookup(ctxt->dict, value, len);
    defaults->values[5 * defaults->nbAttrs + 2] = value;
    defaults->values[5 * defaults->nbAttrs + 3] = value + len;
    if (ctxt->external)
        defaults->values[5 * defaults->nbAttrs + 4] = BAD_CAST "external";
    else
        defaults->values[5 * defaults->nbAttrs + 4] = NULL;
    defaults->nbAttrs++;

    return;

mem_error:
    xmlErrMemory(ctxt, NULL);
    return;
}